

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  stbi__uint32 y;
  stbi__context *s;
  stbi__context *psVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  stbi_uc sVar8;
  int iVar9;
  stbi__uint32 sVar10;
  stbi__uint32 sVar11;
  uint color;
  uint uVar12;
  uint uVar13;
  int iVar14;
  stbi_uc *psVar15;
  stbi_uc *psVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  stbi_uc *psVar20;
  int out_n;
  uint uVar21;
  int iVar22;
  ushort uVar23;
  uint uVar24;
  uint y_00;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  size_t sVar29;
  uint x;
  bool bVar30;
  stbi_uc tc [3];
  stbi__uint16 tc16 [3];
  stbi__uint32 raw_len;
  ulong local_458;
  long local_450;
  stbi_uc *local_448;
  long local_440;
  stbi_uc palette [1024];
  
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar9 = stbi__check_png_header(s);
  if (iVar9 == 0) {
    return 0;
  }
  if (scan == 1) {
    return 1;
  }
  ppsVar1 = &z->idata;
  bVar6 = 0;
  color = 0;
  bVar4 = false;
  bVar30 = true;
  uVar13 = 0;
  uVar12 = 0;
  uVar21 = 0;
  bVar3 = false;
  bVar25 = 0;
  do {
    sVar10 = stbi__get32be(s);
    uVar19 = (ulong)sVar10;
    sVar11 = stbi__get32be(s);
    bVar5 = true;
    if (sVar11 == 0x43674249) {
LAB_0015e873:
      stbi__skip(s,sVar10);
      bVar4 = bVar5;
    }
    else if (sVar11 == 0x49444154) {
      if (bVar30) goto LAB_0015eb5f;
      if ((bVar25 != 0) && (uVar13 == 0)) {
        stbi__g_failure_reason = "no PLTE";
        return 0;
      }
      if (scan == 2) {
        s->img_n = (uint)bVar25;
        return 1;
      }
      uVar28 = uVar21 + sVar10;
      if ((int)uVar28 < (int)uVar21) {
        return 0;
      }
      if (uVar12 < uVar28) {
        if (sVar10 < 0x1001) {
          uVar19 = 0x1000;
        }
        if (uVar12 != 0) {
          uVar19 = (ulong)uVar12;
        }
        do {
          sVar29 = uVar19;
          uVar12 = (uint)sVar29;
          uVar19 = (ulong)(uVar12 * 2);
        } while (uVar12 < uVar28);
        psVar15 = (stbi_uc *)realloc(*ppsVar1,sVar29);
        if (psVar15 == (stbi_uc *)0x0) goto LAB_0015f1e0;
        *ppsVar1 = psVar15;
      }
      else {
        psVar15 = *ppsVar1;
      }
      iVar9 = stbi__getn(s,psVar15 + uVar21,sVar10);
      if (iVar9 == 0) {
        stbi__g_failure_reason = "outofdata";
        return 0;
      }
      bVar30 = false;
      uVar21 = uVar28;
    }
    else if (sVar11 == 0x49484452) {
      if (!bVar30) {
        stbi__g_failure_reason = "multiple IHDR";
        return 0;
      }
      if (sVar10 != 0xd) {
        stbi__g_failure_reason = "bad IHDR len";
        return 0;
      }
      sVar10 = stbi__get32be(s);
      s->img_x = sVar10;
      if (0x1000000 < sVar10) {
LAB_0015eb32:
        stbi__g_failure_reason = "too large";
        return 0;
      }
      sVar10 = stbi__get32be(s);
      s->img_y = sVar10;
      if (0x1000000 < sVar10) goto LAB_0015eb32;
      bVar6 = stbi__get8(s);
      z->depth = (uint)bVar6;
      if ((0x10 < bVar6) || ((0x10116U >> (bVar6 & 0x1f) & 1) == 0)) {
        stbi__g_failure_reason = "1/2/4/8/16-bit only";
        return 0;
      }
      bVar7 = stbi__get8(s);
      if (6 < bVar7) {
LAB_0015eb44:
        stbi__g_failure_reason = "bad ctype";
        return 0;
      }
      color = (uint)bVar7;
      if (bVar7 == 3) {
        bVar25 = 3;
        if (z->depth == 0x10) goto LAB_0015eb44;
      }
      else if ((bVar7 & 1) != 0) goto LAB_0015eb44;
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        stbi__g_failure_reason = "bad comp method";
        return 0;
      }
      sVar8 = stbi__get8(s);
      if (sVar8 != '\0') {
        stbi__g_failure_reason = "bad filter method";
        return 0;
      }
      bVar6 = stbi__get8(s);
      if (1 < bVar6) {
        stbi__g_failure_reason = "bad interlace method";
        return 0;
      }
      uVar28 = s->img_x;
      if ((uVar28 == 0) || (uVar18 = s->img_y, uVar18 == 0)) {
        stbi__g_failure_reason = "0-pixel image";
        return 0;
      }
      if (bVar25 == 0) {
        uVar24 = (uint)(3 < bVar7) + (bVar7 & 2) + 1;
        s->img_n = uVar24;
        if ((uint)((0x40000000 / (ulong)uVar28) / (ulong)uVar24) < uVar18) goto LAB_0015eb32;
        bVar30 = false;
        bVar25 = 0;
        if (scan == 2) {
          return 1;
        }
      }
      else {
        s->img_n = 1;
        bVar30 = false;
        if ((uint)(0x40000000 / (ulong)uVar28 >> 2) < uVar18) goto LAB_0015eb32;
      }
    }
    else {
      if (sVar11 == 0x504c5445) {
        if (bVar30) goto LAB_0015eb5f;
        if ((0x300 < sVar10) || (uVar13 = (sVar10 & 0xffff) / 3, uVar13 * 3 != sVar10)) {
          stbi__g_failure_reason = "invalid PLTE";
          return 0;
        }
        for (uVar19 = 0; uVar13 != uVar19; uVar19 = uVar19 + 1) {
          sVar8 = stbi__get8(s);
          palette[uVar19 * 4] = sVar8;
          sVar8 = stbi__get8(s);
          palette[uVar19 * 4 + 1] = sVar8;
          sVar8 = stbi__get8(s);
          palette[uVar19 * 4 + 2] = sVar8;
          palette[uVar19 * 4 + 3] = 0xff;
        }
      }
      else {
        if (sVar11 != 0x74524e53) {
          if (sVar11 != 0x49454e44) {
            if (bVar30) goto LAB_0015eb5f;
            bVar30 = false;
            bVar5 = bVar4;
            if ((sVar11 >> 0x1d & 1) == 0) {
              uVar13 = sVar11 >> 0x18 | (sVar11 & 0xff0000) >> 8 | (sVar11 & 0xff00) << 8 |
                       sVar11 << 0x18;
              stbi__g_failure_reason = stbi__parse_png_file::invalid_chunk;
              stbi__parse_png_file::invalid_chunk[0] = (char)uVar13;
              stbi__parse_png_file::invalid_chunk[1] = (char)(uVar13 >> 8);
              stbi__parse_png_file::invalid_chunk[2] = (char)(uVar13 >> 0x10);
              stbi__parse_png_file::invalid_chunk[3] = (char)(uVar13 >> 0x18);
              return 0;
            }
            goto LAB_0015e873;
          }
          if (bVar30) {
LAB_0015eb5f:
            stbi__g_failure_reason = "first not IHDR";
            return 0;
          }
          if (scan != 0) {
            return 1;
          }
          if (*ppsVar1 == (stbi_uc *)0x0) {
            stbi__g_failure_reason = "no IDAT";
            return 0;
          }
          raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
          psVar15 = (stbi_uc *)
                    stbi_zlib_decode_malloc_guesssize_headerflag
                              ((char *)*ppsVar1,uVar21,raw_len,(int *)&raw_len,(uint)!bVar4);
          z->expanded = psVar15;
          if (psVar15 == (stbi_uc *)0x0) {
            return 0;
          }
          free(z->idata);
          sVar10 = raw_len;
          z->idata = (stbi_uc *)0x0;
          iVar9 = s->img_n + 1;
          iVar22 = s->img_n;
          if (bVar3) {
            iVar22 = iVar9;
          }
          out_n = iVar22;
          if (req_comp != 3) {
            out_n = iVar9;
          }
          if (bVar25 != 0) {
            out_n = iVar22;
          }
          if (iVar9 != req_comp) {
            out_n = iVar22;
          }
          s->img_out_n = out_n;
          psVar15 = z->expanded;
          local_458 = (ulong)(uint)z->depth;
          sVar11 = z->s->img_x;
          y = z->s->img_y;
          if (bVar6 == 0) {
            iVar9 = stbi__create_png_image_raw(z,psVar15,raw_len,out_n,sVar11,y,z->depth,color);
            if (iVar9 == 0) {
              return 0;
            }
          }
          else {
            psVar16 = (stbi_uc *)malloc((ulong)(sVar11 * out_n * y));
            sVar29 = (size_t)out_n;
            for (lVar27 = 0; lVar27 != 7; lVar27 = lVar27 + 1) {
              psVar2 = z->s;
              uVar13 = (&DAT_00183d70)[lVar27];
              uVar21 = (&DAT_00183db0)[lVar27];
              uVar24 = ~uVar13 + psVar2->img_x + uVar21;
              x = uVar24 / uVar21;
              uVar12 = (&DAT_00183d90)[lVar27];
              uVar28 = (&DAT_00183dd0)[lVar27];
              uVar18 = ~uVar12 + psVar2->img_y + uVar28;
              y_00 = uVar18 / uVar28;
              if ((uVar21 <= uVar24) && (uVar28 <= uVar18)) {
                iVar22 = (int)local_458;
                iVar9 = psVar2->img_n;
                local_448 = psVar15;
                iVar14 = stbi__create_png_image_raw(z,psVar15,sVar10,out_n,x,y_00,iVar22,color);
                if (iVar14 == 0) {
                  free(psVar16);
                  return 0;
                }
                uVar18 = (((int)(x * iVar22 * iVar9 + 7) >> 3) + 1) * y_00;
                local_440 = (long)(int)y_00;
                iVar9 = uVar12 * out_n;
                local_450 = lVar27;
                for (lVar17 = 0; lVar17 < local_440; lVar17 = lVar17 + 1) {
                  psVar15 = psVar16 + (long)(int)uVar13 * sVar29;
                  for (lVar27 = 0; lVar27 < (int)x; lVar27 = lVar27 + 1) {
                    memcpy(psVar15 + z->s->img_x * iVar9,
                           z->out + (lVar27 + lVar17 * (int)x) * sVar29,sVar29);
                    psVar15 = psVar15 + (long)(int)uVar21 * sVar29;
                  }
                  iVar9 = iVar9 + uVar28 * out_n;
                }
                free(z->out);
                psVar15 = local_448 + uVar18;
                sVar10 = sVar10 - uVar18;
                lVar27 = local_450;
              }
            }
            z->out = psVar16;
          }
          if (bVar3) {
            psVar15 = z->out;
            iVar22 = z->s->img_y * z->s->img_x;
            iVar9 = s->img_out_n;
            if (z->depth == 0x10) {
              if (iVar9 == 4) {
                for (lVar27 = 0; iVar22 != (int)lVar27; lVar27 = lVar27 + 1) {
                  if (((*(stbi__uint16 *)(psVar15 + lVar27 * 8) == tc16[0]) &&
                      (*(stbi__uint16 *)(psVar15 + lVar27 * 8 + 2) == tc16[1])) &&
                     (*(stbi__uint16 *)(psVar15 + lVar27 * 8 + 4) == tc16[2])) {
                    (psVar15 + lVar27 * 8 + 6)[0] = '\0';
                    (psVar15 + lVar27 * 8 + 6)[1] = '\0';
                  }
                }
              }
              else {
                if (iVar9 != 2) {
                  __assert_fail("out_n == 2 || out_n == 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                                ,0x10c2,
                                "int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                               );
                }
                for (lVar27 = 0; iVar22 != (int)lVar27; lVar27 = lVar27 + 1) {
                  *(ushort *)(psVar15 + lVar27 * 4 + 2) =
                       -(ushort)(*(stbi__uint16 *)(psVar15 + lVar27 * 4) != tc16[0]);
                }
              }
            }
            else if (iVar9 == 4) {
              for (lVar27 = 0; iVar22 != (int)lVar27; lVar27 = lVar27 + 1) {
                if (((psVar15[lVar27 * 4] == tc[0]) && (psVar15[lVar27 * 4 + 1] == tc[1])) &&
                   (psVar15[lVar27 * 4 + 2] == tc[2])) {
                  psVar15[lVar27 * 4 + 3] = '\0';
                }
              }
            }
            else {
              if (iVar9 != 2) {
                __assert_fail("out_n == 2 || out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                              ,0x10a9,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)")
                ;
              }
              for (lVar27 = 0; iVar22 != (int)lVar27; lVar27 = lVar27 + 1) {
                psVar15[lVar27 * 2 + 1] = -(psVar15[lVar27 * 2] != tc[0]);
              }
            }
          }
          if (((bVar4) && (stbi__de_iphone_flag != 0)) && (2 < s->img_out_n)) {
            psVar2 = z->s;
            psVar15 = z->out;
            iVar9 = psVar2->img_y * psVar2->img_x;
            if (psVar2->img_out_n == 4) {
              if (stbi__unpremultiply_on_load == 0) {
                for (lVar27 = 0; iVar9 != (int)lVar27; lVar27 = lVar27 + 1) {
                  sVar8 = psVar15[lVar27 * 4];
                  psVar15[lVar27 * 4] = psVar15[lVar27 * 4 + 2];
                  psVar15[lVar27 * 4 + 2] = sVar8;
                }
              }
              else {
                for (lVar27 = 0; iVar9 != (int)lVar27; lVar27 = lVar27 + 1) {
                  bVar6 = psVar15[lVar27 * 4];
                  bVar7 = psVar15[lVar27 * 4 + 2];
                  if (psVar15[lVar27 * 4 + 3] != 0) {
                    uVar23 = (ushort)psVar15[lVar27 * 4 + 3];
                    bVar7 = (byte)(((uint)bVar7 * 0xff) / (uint)uVar23);
                    psVar15[lVar27 * 4 + 1] =
                         (stbi_uc)(((uint)psVar15[lVar27 * 4 + 1] * 0xff) / (uint)uVar23);
                    bVar6 = (byte)((ushort)((ushort)bVar6 * 0xff) / uVar23);
                  }
                  psVar15[lVar27 * 4] = bVar7;
                  psVar15[lVar27 * 4 + 2] = bVar6;
                }
              }
            }
            else {
              if (psVar2->img_out_n != 3) {
                __assert_fail("s->img_out_n == 4",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/stb_image.h"
                              ,0x1127,"void stbi__de_iphone(stbi__png *)");
              }
              while (bVar30 = iVar9 != 0, iVar9 = iVar9 + -1, bVar30) {
                sVar8 = *psVar15;
                *psVar15 = psVar15[2];
                psVar15[2] = sVar8;
                psVar15 = psVar15 + 3;
              }
            }
          }
          if (bVar25 != 0) {
            s->img_n = (uint)bVar25;
            uVar13 = (uint)bVar25;
            if (2 < req_comp) {
              uVar13 = req_comp;
            }
            s->img_out_n = uVar13;
            psVar15 = z->out;
            uVar21 = z->s->img_y * z->s->img_x;
            psVar16 = (stbi_uc *)malloc((ulong)(uVar21 * uVar13));
            if (psVar16 == (stbi_uc *)0x0) {
LAB_0015f1e0:
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            uVar19 = 0;
            psVar20 = psVar16;
            if (uVar13 == 3) {
              for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
                uVar26 = (ulong)psVar15[uVar19];
                *psVar20 = palette[uVar26 * 4];
                psVar20[1] = palette[uVar26 * 4 + 1];
                psVar20[2] = palette[uVar26 * 4 + 2];
                psVar20 = psVar20 + 3;
              }
            }
            else {
              for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
                *(undefined4 *)(psVar16 + uVar19 * 4) =
                     *(undefined4 *)(palette + (ulong)psVar15[uVar19] * 4);
              }
            }
            free(psVar15);
            z->out = psVar16;
          }
          free(z->expanded);
          z->expanded = (stbi_uc *)0x0;
          return 1;
        }
        if (bVar30) goto LAB_0015eb5f;
        if (*ppsVar1 != (stbi_uc *)0x0) {
          stbi__g_failure_reason = "tRNS after IDAT";
          return 0;
        }
        if (bVar25 == 0) {
          uVar28 = s->img_n;
          if ((uVar28 & 1) == 0) {
            stbi__g_failure_reason = "tRNS with alpha";
            return 0;
          }
          if (uVar28 * 2 != sVar10) goto LAB_0015ebca;
          if (z->depth == 0x10) {
            for (lVar27 = 0; lVar27 < (int)uVar28; lVar27 = lVar27 + 1) {
              iVar9 = stbi__get16be(s);
              tc16[lVar27] = (stbi__uint16)iVar9;
              uVar28 = s->img_n;
            }
          }
          else {
            for (lVar27 = 0; lVar27 < (int)uVar28; lVar27 = lVar27 + 1) {
              iVar9 = stbi__get16be(s);
              tc[lVar27] = ""[z->depth] * (char)iVar9;
              uVar28 = s->img_n;
            }
          }
          bVar3 = true;
          bVar30 = false;
          bVar25 = 0;
          goto LAB_0015eb25;
        }
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (uVar13 == 0) {
          stbi__g_failure_reason = "tRNS before PLTE";
          return 0;
        }
        if (uVar13 < sVar10) {
LAB_0015ebca:
          stbi__g_failure_reason = "bad tRNS len";
          return 0;
        }
        for (uVar26 = 0; uVar19 != uVar26; uVar26 = uVar26 + 1) {
          sVar8 = stbi__get8(s);
          palette[uVar26 * 4 + 3] = sVar8;
        }
        bVar25 = 4;
      }
      bVar30 = false;
    }
LAB_0015eb25:
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3];
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
			if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}